

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext *ctx,ExprReturn *node)

{
  TypeBase *targetType;
  ExpressionContext *pEVar1;
  LLVMValueRef value;
  TypeBase *pTVar2;
  long lVar3;
  TypeBase *pTVar4;
  TypeBase *pTVar5;
  
  value = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  targetType = node->value->type;
  pEVar1 = ctx->ctx;
  if (targetType == pEVar1->typeVoid) {
    if (ctx->currentFunctionGlobal != false) {
      __assert_fail("!ctx.currentFunctionGlobal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x5b1,"LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)")
      ;
    }
    goto LAB_0026c6eb;
  }
  pTVar2 = pEVar1->typeBool;
  if (ctx->currentFunctionGlobal == false) {
    lVar3 = 0x89d8;
    if (((pTVar2 == targetType) || (pEVar1->typeChar == targetType)) ||
       (pEVar1->typeShort == targetType)) {
LAB_0026c6dc:
      pTVar2 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
    }
    else {
      pTVar2 = targetType;
      if (pEVar1->typeFloat == targetType) {
        lVar3 = 0x89f0;
        goto LAB_0026c6dc;
      }
    }
    ConvertToDataType(ctx,value,pTVar2,targetType);
    goto LAB_0026c6eb;
  }
  lVar3 = 0x89d8;
  if (((pTVar2 == targetType) || (pEVar1->typeChar == targetType)) ||
     (pEVar1->typeShort == targetType)) {
LAB_0026c5d6:
    pTVar5 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
  }
  else {
    pTVar5 = targetType;
    if (pEVar1->typeFloat == targetType) {
      lVar3 = 0x89f0;
      goto LAB_0026c5d6;
    }
  }
  pTVar4 = pEVar1->typeInt;
  if ((pTVar5 != pTVar4) && ((targetType == (TypeBase *)0x0 || (targetType->typeID != 0x19)))) {
    pTVar5 = pTVar4;
    if ((pTVar2 != targetType) &&
       (((pEVar1->typeChar != targetType && (pEVar1->typeShort != targetType)) &&
        (pTVar5 = targetType, pEVar1->typeFloat == targetType)))) {
      pTVar5 = pEVar1->typeDouble;
    }
    if (pTVar5 != pEVar1->typeLong) {
      if (((pTVar2 != targetType) && (pEVar1->typeChar != targetType)) &&
         ((pEVar1->typeShort != targetType && (pTVar4 = targetType, pEVar1->typeFloat == targetType)
          ))) {
        pTVar4 = pEVar1->typeDouble;
      }
      if (pTVar4 != pEVar1->typeDouble) {
        __assert_fail("!\"unknown global return type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x5d3,
                      "LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)");
      }
    }
  }
LAB_0026c6eb:
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &ctx, ExprReturn *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	if(node->value->type == ctx.ctx.typeVoid)
	{
		assert(!ctx.currentFunctionGlobal);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		if(ctx.currentFunctionGlobal)
		{
			if(GetStackType(ctx, node->value->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->value->type))
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnInt"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeLong)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnLong"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeDouble)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnDouble"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				assert(!"unknown global return type");
			}
		}
		else
		{
			value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

			if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
			{
				LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				LLVMBuildRet(ctx.builder, value);
			}
		}
	}

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_return");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}